

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O0

void CharConvSW(charconv *CC,char *Out,size_t OutLen,wchar_t *In)

{
  size_t sVar1;
  bool bVar2;
  undefined1 local_50;
  wchar_t *local_48;
  size_t _OutLen;
  char *_Out;
  size_t _InLen;
  char *_In;
  wchar_t *In_local;
  size_t OutLen_local;
  char *Out_local;
  charconv *CC_local;
  
  if (OutLen != 0) {
    _InLen = (size_t)In;
    _In = (char *)In;
    In_local = (wchar_t *)OutLen;
    OutLen_local = (size_t)Out;
    Out_local = (char *)CC;
    sVar1 = wcslen(In);
    _Out = (char *)(sVar1 + 1);
    _OutLen = OutLen_local;
    local_48 = In_local;
    if ((((Out_local == (char *)0x0) || (_Out == (char *)0x0)) ||
        (sVar1 = iconv(Out_local,(char **)&_InLen,(size_t *)&_Out,(char **)&_OutLen,
                       (size_t *)&local_48), sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)&_OutLen,(size_t *)&local_48),
       sVar1 == 0xffffffffffffffff)) {
      while( true ) {
        bVar2 = false;
        if ((wchar_t *)0x1 < In_local) {
          bVar2 = *(int *)_In != 0;
        }
        if (!bVar2) break;
        if (*(int *)_In < 0x100) {
          local_50 = (undefined1)*(undefined4 *)_In;
        }
        else {
          local_50 = 0x2a;
        }
        *(undefined1 *)OutLen_local = local_50;
        _In = _In + 4;
        In_local = (wchar_t *)((long)In_local + -1);
        OutLen_local = OutLen_local + 1;
      }
      *(undefined1 *)OutLen_local = 0;
      if ((Out_local != (char *)0x0) && (_Out != (char *)0x0)) {
        iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *(undefined1 *)_OutLen = 0;
    }
  }
  return;
}

Assistant:

void CharConvSW(charconv* CC, char* Out, size_t OutLen, const wchar_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = wcslen(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                    iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            for (;OutLen>1 && *In;++In,--OutLen,++Out)
                *Out = (char)(*In>255?'*':*In);
            *Out = 0;
            if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *_Out=0;
    }
}